

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

bool OpenMD::hasDuplicateElement<std::vector<int,std::allocator<int>>>
               (vector<int,_std::allocator<int>_> *cont)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  size_type sVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *in_RDI;
  byte bVar4;
  vector<int,_std::allocator<int>_> tmp;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff50
  ;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff60;
  vector<int,_std::allocator<int>_> *this;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff68;
  const_iterator __last;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff98;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> local_20;
  vector<int,_std::allocator<int>_> *local_8;
  
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  _Var1._M_current._7_1_ = in_stack_ffffffffffffff5f;
  _Var1._M_current._0_7_ = in_stack_ffffffffffffff58;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_stack_ffffffffffffff60,_Var1);
  __last._M_current = (int *)&local_20;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  _Var1 = std::unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            (in_stack_ffffffffffffff50,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_ffffffffffffff48);
  this = &local_20;
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff48);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            (in_stack_ffffffffffffff50,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_ffffffffffffff48);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff68._M_current,
             (const_iterator)_Var1._M_current,__last);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_20);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(local_8);
  bVar4 = sVar2 != sVar3;
  std::vector<int,_std::allocator<int>_>::~vector(this);
  return (bool)(bVar4 & 1);
}

Assistant:

bool hasDuplicateElement(const ContainerType& cont) {
    ContainerType tmp = cont;
    std::sort(tmp.begin(), tmp.end());
    tmp.erase(std::unique(tmp.begin(), tmp.end()), tmp.end());
    return tmp.size() != cont.size();
  }